

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O1

void jsons_print_feature(lyout *out,lys_feature *feat,int *first)

{
  ly_set *plVar1;
  char *pcVar2;
  ulong uVar3;
  int local_34 [2];
  int f;
  
  local_34[0] = 1;
  if (first == (int *)0x0) {
    pcVar2 = ",";
  }
  else {
    pcVar2 = "";
    if (*first == 0) {
      pcVar2 = ",";
    }
  }
  ly_print(out,"%s\"%s\":{",pcVar2,feat->name);
  jsons_print_text(out,"description","text",feat->dsc,1,local_34);
  jsons_print_text(out,"reference","text",feat->ref,1,local_34);
  jsons_print_status(out,feat->flags,local_34);
  jsons_print_iffeatures(out,feat->module,feat->iffeature,feat->iffeature_size,local_34);
  if ((feat->depfeatures != (ly_set *)0x0) && (feat->depfeatures->number != 0)) {
    pcVar2 = "";
    if (local_34[0] == 0) {
      pcVar2 = ",";
    }
    ly_print(out,"%s\"depending-features\":[",pcVar2);
    plVar1 = feat->depfeatures;
    if (plVar1->number != 0) {
      uVar3 = 0;
      do {
        pcVar2 = ",";
        if (uVar3 == 0) {
          pcVar2 = "";
        }
        ly_print(out,"%s\"%s\"",pcVar2,(plVar1->set).s[uVar3]->name);
        uVar3 = uVar3 + 1;
        plVar1 = feat->depfeatures;
      } while (uVar3 < plVar1->number);
    }
    ly_print(out,"]");
  }
  ly_print(out,"}");
  if (first != (int *)0x0) {
    *first = 0;
  }
  return;
}

Assistant:

static void
jsons_print_feature(struct lyout *out, const struct lys_feature *feat, int *first)
{
    int f = 1;
    unsigned int j;

    ly_print(out, "%s\"%s\":{", (first && (*first)) ? "" : ",", feat->name);
    jsons_print_text(out, "description", "text", feat->dsc, 1, &f);
    jsons_print_text(out, "reference", "text", feat->ref, 1, &f);
    jsons_print_status(out, feat->flags, &f);
    jsons_print_iffeatures(out, feat->module, feat->iffeature, feat->iffeature_size, &f);
    if (feat->depfeatures && feat->depfeatures->number) {
        ly_print(out, "%s\"depending-features\":[", f ? "" : ",");
        for (j = 0; j < feat->depfeatures->number; ++j) {
            ly_print(out, "%s\"%s\"", j ? "," : "", ((struct lys_feature*)(feat->depfeatures->set.g[j]))->name);
        }
        ly_print(out, "]");
    }
    ly_print(out, "}");
    if (first) {
        (*first) = 0;
    }
}